

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_reader.cpp
# Opt level: O3

buffer_reader * __thiscall buffer_reader::operator>>(buffer_reader *this,string *string)

{
  size_t size;
  uint64_t local_20;
  
  local_20 = 0;
  operator>>(this,&local_20);
  std::__cxx11::string::resize((ulong)string,(char)local_20);
  return this;
}

Assistant:

buffer_reader& buffer_reader::operator>>(std::string& string)
{
    std::size_t size = 0;
    *this >> size;
    string.resize(size);

    for(std::size_t i = 0; i < size; ++i)
    {
        //*this >> string[i];
    }

    return *this;
}